

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *v)

{
  ostream *ofs;
  ulong uVar1;
  pointer pSVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pSVar2 = (v->super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>)._M_impl.
      super__Vector_impl_data._M_finish != pSVar2) {
    lVar3 = 0x40;
    uVar1 = 0;
    do {
      ofs = operator<<(os,(AssetPath *)((long)pSVar2 + lVar3 + -0x40));
      operator<<(ofs,(LayerOffset *)
                     ((long)&(pSVar2->assetPath).asset_path_._M_dataplus._M_p + lVar3));
      if (uVar1 != ((long)(v->
                          super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->
                          super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333 -
                   1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      pSVar2 = (v->super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x50;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4)
                            * -0x3333333333333333));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}